

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O1

int __thiscall
CVmObjVector::getp_copy_from(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  size_t idx;
  vm_val_t src_val;
  vm_val_t val;
  vm_val_t local_68;
  vm_val_t local_50;
  vm_val_t local_40;
  
  if (getp_copy_from(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_copy_from();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_copy_from::desc);
  if (iVar3 != 0) {
    return 1;
  }
  local_68.typ = sp_[-1].typ;
  local_68._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
  local_68.val = sp_[-1].val;
  sp_ = sp_ + -1;
  iVar3 = vm_val_t::is_listlike(&local_68);
  if ((iVar3 != 0) && (iVar3 = vm_val_t::ll_length(&local_68), -1 < iVar3)) {
    iVar4 = CVmBif::pop_int_val();
    iVar4 = (iVar4 >> 0x1f & iVar3 + 1U) + iVar4;
    uVar1 = *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    iVar5 = CVmBif::pop_int_val();
    iVar5 = (iVar5 >> 0x1f & uVar1 + 1) + iVar5;
    uVar6 = CVmBif::pop_int_val();
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    if (iVar5 < 2) {
      iVar5 = 1;
    }
    uVar2 = iVar3 - (iVar4 + -1);
    if ((int)(uVar6 + iVar4 + -1) < iVar3) {
      uVar2 = uVar6;
    }
    uVar6 = 0;
    if (iVar4 <= iVar3) {
      uVar6 = uVar2;
    }
    iVar3 = uVar6 + iVar5 + -1;
    if ((int)(uint)uVar1 < iVar3) {
      set_element_count_undo(this,self,(long)iVar3);
    }
    if (0 < (int)uVar6) {
      idx = (size_t)(iVar5 - 1);
      uVar7 = (ulong)uVar6;
      do {
        local_50.typ = VM_INT;
        local_50.val.intval = iVar4;
        vm_val_t::ll_index(&local_68,&local_40,&local_50);
        set_element_undo(this,self,idx,&local_40);
        iVar4 = iVar4 + 1;
        idx = idx + 1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
    return 1;
  }
  err_throw(0x900);
}

Assistant:

int CVmObjVector::getp_copy_from(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                 uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(4);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve the source value */
    vm_val_t src_val;
    G_stk->pop(&src_val);

    /* make sure the source argument is list-like, and get its length */
    int src_cnt;
    if (!src_val.is_listlike(vmg0_)
        || (src_cnt = src_val.ll_length(vmg0_)) < 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* get the source starting index, adjusting negatives to count from end */
    int src_start = CVmBif::pop_int_val(vmg0_);
    if (src_start < 0)
        src_start += src_cnt + 1;

    /* note the destination length (i.e., my element count) */
    int dst_cnt = get_element_count();

    /* get the destination starting index, adjusting negative values */
    int dst_start = CVmBif::pop_int_val(vmg0_);
    if (dst_start < 0)
        dst_start += dst_cnt + 1;

    /* get the number of elements to copy */
    int copy_cnt = CVmBif::pop_int_val(vmg0_);

    /* if either starting index is below 1, force it to 1 */
    if (src_start < 1)
        src_start = 1;
    if (dst_start < 1)
        dst_start = 1;

    /* adjust the starting indices to 0-based values */
    --src_start;
    --dst_start;

    /* limit our copying to the remaining elements of the source */
    if (src_start >= src_cnt)
        copy_cnt = 0;
    else if (src_start + copy_cnt >= src_cnt)
        copy_cnt = src_cnt - src_start;

    /* expand the vector if necessary to make room for added elements */
    if (dst_start + copy_cnt > dst_cnt)
        set_element_count_undo(vmg_ self, dst_start + copy_cnt);

    /* set the list elements */
    for (int i = 0 ; i < copy_cnt ; ++i)
    {
        /* get the source element at this index */
        vm_val_t val;
        src_val.ll_index(vmg_ &val, i + src_start + 1);

        /* set my element at this index, recording undo for the change */
        set_element_undo(vmg_ self, i + dst_start, &val);
    }

    /* the return value is 'self' */
    retval->set_obj(self);

    /* handled */
    return TRUE;
}